

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toctree.c
# Opt level: O2

bc_slist_t * blogc_toctree_append(bc_slist_t *headers,size_t level,char *slug,char *text)

{
  size_t *data;
  char *pcVar1;
  bc_slist_t *pbVar2;
  
  if (level != 0) {
    data = (size_t *)bc_malloc(0x18);
    *data = level;
    pcVar1 = bc_strdup(slug);
    data[1] = (size_t)pcVar1;
    pcVar1 = bc_strdup(text);
    data[2] = (size_t)pcVar1;
    pbVar2 = bc_slist_append(headers,data);
    return pbVar2;
  }
  return headers;
}

Assistant:

bc_slist_t*
blogc_toctree_append(bc_slist_t *headers, size_t level, const char *slug, const char *text)
{
    if (level == 0)
        return headers;

    blogc_toctree_header_t *t = bc_malloc(sizeof(blogc_toctree_header_t));
    t->level = level;
    t->slug = bc_strdup(slug);
    t->text = bc_strdup(text);
    return bc_slist_append(headers, t);
}